

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<7u,Fixpp::Type::Int>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)50>,Fixpp::Required<Fixpp::TagT<7u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<16u,Fixpp::Type::Int>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<7u,Fixpp::Type::Int>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_2_>,_Fixpp::Required<Fixpp::TagT<7U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<16U,_Fixpp::Type::Int>_>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  Type type;
  StreamBuf<char> *pSVar9;
  
  this_00 = context->cursor;
  pSVar9 = this_00->buf;
  lVar1 = *(long *)&pSVar9->field_0x8;
  pcVar8 = *(char **)&pSVar9->field_0x10;
  pcVar5 = pcVar8;
  while( true ) {
    pcVar7 = *(char **)&pSVar9->field_0x18;
    if (pcVar7 == pcVar5) {
      lVar6 = (**(code **)(*(long *)pSVar9 + 0x38))();
      if (lVar6 == 0) {
        pcVar8 = "Expected value tag \'%d\', got EOF";
        type = ParsingError;
        goto LAB_00405842;
      }
      pSVar9 = this_00->buf;
      pcVar5 = *(char **)&pSVar9->field_0x10;
      pcVar7 = *(char **)&pSVar9->field_0x18;
    }
    if (pcVar5 < pcVar7) {
      cVar3 = *pcVar5;
    }
    else {
      cVar3 = (**(code **)(*(long *)pSVar9 + 0x48))();
    }
    if (cVar3 == '|') break;
    StreamCursor::advance(this_00,1);
    pSVar9 = this_00->buf;
    pcVar5 = *(char **)&pSVar9->field_0x10;
  }
  lVar6 = *(long *)&this_00->buf->field_0x8;
  lVar2 = *(long *)&this_00->buf->field_0x10;
  bVar4 = StreamCursor::advance(this_00,1);
  if (bVar4) {
    (field->m_view).first = pcVar8;
    (field->m_view).second = (lVar1 + lVar2) - (long)(pcVar8 + lVar6);
    *(byte *)&(tagSet->
              super_TagSet<Fixpp::Required<Fixpp::TagT<7U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<16U,_Fixpp::Type::Int>_>_>
              ).bits.super__Base_bitset<1UL>._M_w =
         (byte)(tagSet->
               super_TagSet<Fixpp::Required<Fixpp::TagT<7U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<16U,_Fixpp::Type::Int>_>_>
               ).bits.super__Base_bitset<1UL>._M_w | 0x80;
    return;
  }
  pcVar8 = "Expected value after tag \'%d\', got EOF";
  type = Incomplete;
LAB_00405842:
  ParsingContext::setError(context,type,pcVar8,7);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }